

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deleteUnusedVariables.cpp
# Opt level: O2

void deleteUnusedVariables(Module *module,Program *program)

{
  Value *val;
  bool bVar1;
  Func *this;
  Block *block;
  Expr *pEVar2;
  Module *pMVar3;
  Function *f;
  Value *this_00;
  BasicBlock *pBVar4;
  Function *block_00;
  Function *pFVar5;
  
  for (pMVar3 = module + 0x20; pMVar3 = *(Module **)pMVar3, pMVar3 != module + 0x18;
      pMVar3 = pMVar3 + 8) {
    f = (Function *)(pMVar3 + -0x38);
    if (pMVar3 == (Module *)0x0) {
      f = (Function *)0x0;
    }
    this = Program::getFunction(program,f);
    for (pFVar5 = f + 0x50; pFVar5 = *(Function **)pFVar5, pFVar5 != f + 0x48; pFVar5 = pFVar5 + 8)
    {
      block_00 = pFVar5 + -0x18;
      if (pFVar5 == (Function *)0x0) {
        block_00 = (Function *)0x0;
      }
      block = Func::getBlock(this,(BasicBlock *)block_00);
      for (pBVar4 = (BasicBlock *)block_00 + 0x30; pBVar4 = *(BasicBlock **)pBVar4,
          pBVar4 != (BasicBlock *)block_00 + 0x28; pBVar4 = pBVar4 + 8) {
        this_00 = (Value *)(pBVar4 + -0x18);
        if (pBVar4 == (BasicBlock *)0x0) {
          this_00 = (Value *)0x0;
        }
        if (this_00[0x10] == (Value)0x3a) {
          bVar1 = llvm::Value::hasOneUse(this_00);
          if (bVar1) {
            pEVar2 = Func::getExpr(this,this_00);
            val = *(Value **)(*(long *)(this_00 + 8) + 0x18);
            if ((((val != (Value *)0x0) && (val[0x10] == (Value)0x3c)) &&
                (*(Value **)(val + -0x40) != this_00)) && (*(Value **)(val + -0x20) == this_00)) {
              deleteExprFromBlock(block,pEVar2);
              pEVar2 = Func::getExpr(this,val);
              deleteExprFromBlock(block,pEVar2);
            }
          }
        }
      }
    }
  }
  Program::addPass(program,DeleteUnusedVariables);
  return;
}

Assistant:

void deleteUnusedVariables(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateExpressions));
    for (const llvm::Function& func : module->functions()) {
        auto* function = program.getFunction(&func);
        for (const auto& block : func) {
            auto* myBlock = function->getBlock(&block);

            for (const auto& ins : block) {
                if (ins.getOpcode() == llvm::Instruction::Alloca) {
                    if (ins.hasOneUse()) {
                        auto* alloca = function->getExpr(&ins);
                        auto* user = llvm::dyn_cast_or_null<llvm::StoreInst>(*ins.users().begin());
                        if (!user) {
                            continue;
                        }

                        // make sure the allocation is only used as a target of store
                        if (user->getValueOperand() != &ins && user->getPointerOperand() == &ins) {
                            deleteExprFromBlock(myBlock, alloca);
                            deleteExprFromBlock(myBlock, function->getExpr(user));
                        }
                    }
                }
            }
        }
    }

    program.addPass(PassType::DeleteUnusedVariables);
}